

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void ClipperLib::InitEdge(TEdge *e,TEdge *eNext,TEdge *ePrev,IntPoint *pt,PolyType polyType)

{
  long64 lVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  memset(e,0,0x90);
  e->next = eNext;
  e->prev = ePrev;
  lVar1 = pt->X;
  e->xcurr = lVar1;
  lVar3 = pt->Y;
  e->ycurr = lVar3;
  if (lVar3 < eNext->ycurr) {
    e->xtop = lVar1;
    e->ytop = lVar3;
    e->xbot = eNext->xcurr;
    iVar2 = -1;
    lVar3 = 8;
  }
  else {
    e->xbot = lVar1;
    e->ybot = lVar3;
    e->xtop = eNext->xcurr;
    iVar2 = 1;
    lVar3 = 0x28;
  }
  *(long64 *)((long)&e->xbot + lVar3) = eNext->ycurr;
  e->windDelta = iVar2;
  lVar3 = e->ytop - e->ybot;
  if (lVar3 == 0) {
    dVar4 = -1e+40;
  }
  else {
    dVar4 = (double)(e->xtop - e->xbot) / (double)lVar3;
  }
  e->dx = dVar4;
  e->polyType = polyType;
  e->outIdx = -1;
  return;
}

Assistant:

void InitEdge(TEdge *e, TEdge *eNext,
  TEdge *ePrev, const IntPoint &pt, PolyType polyType)
{
  std::memset( e, 0, sizeof( TEdge ));

  e->next = eNext;
  e->prev = ePrev;
  e->xcurr = pt.X;
  e->ycurr = pt.Y;
  if (e->ycurr >= e->next->ycurr)
  {
    e->xbot = e->xcurr;
    e->ybot = e->ycurr;
    e->xtop = e->next->xcurr;
    e->ytop = e->next->ycurr;
    e->windDelta = 1;
  } else
  {
    e->xtop = e->xcurr;
    e->ytop = e->ycurr;
    e->xbot = e->next->xcurr;
    e->ybot = e->next->ycurr;
    e->windDelta = -1;
  }
  SetDx(*e);
  e->polyType = polyType;
  e->outIdx = -1;
}